

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void comment_end_fun(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_RSI;
  long in_RDI;
  char *escape;
  char query [4608];
  undefined4 in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffede0;
  char local_1218 [4584];
  char *in_stack_ffffffffffffffd0;
  
  pcVar2 = strstr(in_RSI,"\"");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = escape_string(in_stack_ffffffffffffffd0);
    uVar1 = (uint)*(short *)(*(long *)(in_RDI + 0xc0) + 0xb0a);
    ch_00 = *(CHAR_DATA **)(in_RDI + 0xf0);
    pcVar3 = log_time();
    sprintf(local_1218,"INSERT INTO sitecomments VALUES(%d, nullptr, \"%s\", \"%s\", \"%s\")",
            (ulong)uVar1,ch_00,pcVar3,pcVar2);
    one_query((char *)CONCAT44(uVar1,in_stack_ffffffffffffedd0));
    sprintf(local_1218,"Your comment was added.  Use sitetrack %d to view your comments.\n\r",
            (ulong)(uint)(int)*(short *)(*(long *)(in_RDI + 0xc0) + 0xb0a));
    send_to_char(pcVar2,ch_00);
    **(undefined1 **)(*(long *)(in_RDI + 0xc0) + 3000) = 0;
  }
  else {
    send_to_char(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
  }
  return;
}

Assistant:

void comment_end_fun(CHAR_DATA *ch, char *argument)
{
	char query[MSL];
	char *escape;

	if (strstr(argument, "\""))
	{
		send_to_char("Error:  Your comment contained a double-quotation mark.  You must use single quotes to prevent errors.\n\r", ch);
		return;
	}

	escape = escape_string(argument);
	sprintf(query, "INSERT INTO sitecomments VALUES(%d, nullptr, \"%s\", \"%s\", \"%s\")",
		ch->pcdata->helpid,
		ch->true_name,
		log_time(),
		escape);
	one_query(query);

	sprintf(query, "Your comment was added.  Use sitetrack %d to view your comments.\n\r", ch->pcdata->helpid);
	send_to_char(query, ch);
	ch->pcdata->entered_text[0] = '\0';
}